

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O0

void __thiscall
randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true>::CompiledVm
          (CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true> *this)

{
  VmBase<randomx::AlignedAllocator<64UL>,_true> *in_RDI;
  JitCompilerX86 *in_stack_00000030;
  
  VmBase<randomx::AlignedAllocator<64UL>,_true>::VmBase(in_RDI);
  (in_RDI->super_randomx_vm)._vptr_randomx_vm = (_func_int **)&PTR__CompiledVm_00162248;
  JitCompilerX86::JitCompilerX86(in_stack_00000030);
  return;
}

Assistant:

CompiledVm<Allocator, softAes, secureJit>::CompiledVm() {
		if (!secureJit) {
			compiler.enableAll(); //make JIT buffer both writable and executable
		}
	}